

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_move_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_15662d::CpuMoveTest_tsx_sets_z_flag_Test::~CpuMoveTest_tsx_sets_z_flag_Test
          (CpuMoveTest_tsx_sets_z_flag_Test *this)

{
  CpuMoveTest_tsx_sets_z_flag_Test *this_local;
  
  ~CpuMoveTest_tsx_sets_z_flag_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuMoveTest, tsx_sets_z_flag) {
    stage_instruction(TSX);
    move_test_sets_z(&expected.x, &expected.sp, &registers.sp);
}